

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys_test.cpp
# Opt level: O2

void __thiscall jbcoin::tests::ValidatorKeys_test::testMakeValidatorKeys(ValidatorKeys_test *this)

{
  uint8_t *this_00;
  bool bVar1;
  Value *pVVar2;
  char *value;
  string *expectedError;
  long lVar3;
  Value jv;
  path keyFile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  string local_420;
  value_type keyType;
  ValidatorKeys keys2;
  KeyType keyType_1;
  string local_378;
  string error;
  string subdir;
  KeyFileGuard g;
  ValidatorKeys keys;
  ValidatorKeys local_f0;
  ValidatorKeys local_90;
  
  std::__cxx11::string::string((string *)&keys,"Make Validator Keys",(allocator *)&keys2);
  beast::unit_test::suite::testcase_t::operator()
            (&(this->super_suite).testcase,(string *)&keys,no_abort_on_fail);
  std::__cxx11::string::~string((string *)&keys);
  std::__cxx11::string::string((string *)&subdir,"test_key_file",(allocator *)&keys);
  std::__cxx11::string::string((string *)&keys,(string *)&subdir);
  boost::filesystem::path::path((path *)&keys2,"validator_keys.json");
  boost::filesystem::operator/(&keyFile,(path *)&keys,(path *)&keys2);
  std::__cxx11::string::~string((string *)&keys2);
  std::__cxx11::string::~string((string *)&keys);
  for (lVar3 = 0x328; lVar3 != 0x330; lVar3 = lVar3 + 4) {
    keyType = *(value_type *)((long)&(this->super_suite)._vptr_suite + lVar3);
    ValidatorKeys::ValidatorKeys(&keys,&keyType);
    KeyFileGuard::KeyFileGuard(&g,&this->super_suite,&subdir);
    ValidatorKeys::writeToFile(&keys,&keyFile);
    keys2.keyType_._0_1_ = boost::filesystem::exists(&keyFile);
    beast::unit_test::suite::expect<bool>
              (&this->super_suite,(bool *)&keys2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0x4a);
    ValidatorKeys::make_ValidatorKeys(&keys2,&keyFile);
    bVar1 = ValidatorKeys::operator==(&keys,&keys2);
    error._M_dataplus._M_p._0_1_ = bVar1;
    beast::unit_test::suite::expect<bool>
              (&this->super_suite,(bool *)&error,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0x4d);
    SecretKey::~SecretKey(&keys2.secretKey_);
    KeyFileGuard::~KeyFileGuard(&g);
    SecretKey::~SecretKey(&keys.secretKey_);
  }
  KeyFileGuard::KeyFileGuard(&g,&this->super_suite,&subdir);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyType,
                 "Failed to open key file: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyFile);
  error._M_dataplus._M_p = (pointer)&error.field_2;
  error._M_string_length = 0;
  error.field_2._M_local_buf[0] = '\0';
  ValidatorKeys::make_ValidatorKeys(&local_90,&keyFile);
  SecretKey::~SecretKey(&local_90.secretKey_);
  keys.keyType_._0_1_ =
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyType
                      );
  beast::unit_test::suite::expect<bool>
            (&this->super_suite,(bool *)&keys,
             "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
             ,0x5b);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys,
                 "Unable to parse json key file: ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyFile);
  std::__cxx11::string::operator=((string *)&keyType,(string *)&keys);
  std::__cxx11::string::~string((string *)&keys);
  std::ofstream::ofstream(&keys,(string *)&keyFile,_S_trunc);
  std::operator<<((ostream *)&keys,"{{}");
  std::ofstream::close();
  std::ofstream::~ofstream(&keys);
  ValidatorKeys::make_ValidatorKeys(&local_f0,&keyFile);
  SecretKey::~SecretKey(&local_f0.secretKey_);
  keys.keyType_._0_1_ =
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&error,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyType
                      );
  beast::unit_test::suite::expect<bool>
            (&this->super_suite,(bool *)&keys,
             "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
             ,0x6b);
  Json::Value::Value(&jv,nullValue);
  Json::Value::Value((Value *)&keys,"field");
  pVVar2 = Json::Value::operator[](&jv,"dummy");
  Json::Value::operator=(pVVar2,(Value *)&keys);
  Json::Value::~Value((Value *)&keys);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys2,
                 "Key file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyFile);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys2,
                 "\' is missing \"key_type\" field");
  std::__cxx11::string::operator=((string *)&keyType,(string *)&keys);
  std::__cxx11::string::~string((string *)&keys);
  std::__cxx11::string::~string((string *)&keys2);
  testKeyFile(this,&keyFile,&jv,(string *)&keyType);
  Json::Value::Value((Value *)&keys,"dummy keytype");
  pVVar2 = Json::Value::operator[](&jv,"key_type");
  Json::Value::operator=(pVVar2,(Value *)&keys);
  Json::Value::~Value((Value *)&keys);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys2,
                 "Key file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyFile);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys2,
                 "\' is missing \"secret_key\" field");
  std::__cxx11::string::operator=((string *)&keyType,(string *)&keys);
  std::__cxx11::string::~string((string *)&keys);
  std::__cxx11::string::~string((string *)&keys2);
  testKeyFile(this,&keyFile,&jv,(string *)&keyType);
  Json::Value::Value((Value *)&keys,"dummy secret");
  pVVar2 = Json::Value::operator[](&jv,"secret_key");
  Json::Value::operator=(pVVar2,(Value *)&keys);
  Json::Value::~Value((Value *)&keys);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys2,
                 "Key file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyFile);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys2,
                 "\' is missing \"token_sequence\" field");
  std::__cxx11::string::operator=((string *)&keyType,(string *)&keys);
  std::__cxx11::string::~string((string *)&keys);
  std::__cxx11::string::~string((string *)&keys2);
  testKeyFile(this,&keyFile,&jv,(string *)&keyType);
  Json::Value::Value((Value *)&keys,"dummy sequence");
  pVVar2 = Json::Value::operator[](&jv,"token_sequence");
  Json::Value::operator=(pVVar2,(Value *)&keys);
  Json::Value::~Value((Value *)&keys);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys2,
                 "Key file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyFile);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys2,
                 "\' is missing \"revoked\" field");
  std::__cxx11::string::operator=((string *)&keyType,(string *)&keys);
  std::__cxx11::string::~string((string *)&keys);
  std::__cxx11::string::~string((string *)&keys2);
  testKeyFile(this,&keyFile,&jv,(string *)&keyType);
  Json::Value::Value((Value *)&keys,"dummy revoked");
  pVVar2 = Json::Value::operator[](&jv,"revoked");
  Json::Value::operator=(pVVar2,(Value *)&keys);
  Json::Value::~Value((Value *)&keys);
  std::operator+(&local_440,"Key file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyFile);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys2,
                 &local_440,"\' contains invalid \"key_type\" field: ");
  pVVar2 = Json::Value::operator[](&jv,"key_type");
  Json::Value::toStyledString_abi_cxx11_(&local_420,pVVar2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys2,
                 &local_420);
  std::__cxx11::string::operator=((string *)&keyType,(string *)&keys);
  std::__cxx11::string::~string((string *)&keys);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&keys2);
  std::__cxx11::string::~string((string *)&local_440);
  testKeyFile(this,&keyFile,&jv,(string *)&keyType);
  keyType_1 = ed25519;
  value = to_string(ed25519);
  Json::Value::Value((Value *)&keys,value);
  pVVar2 = Json::Value::operator[](&jv,"key_type");
  Json::Value::operator=(pVVar2,(Value *)&keys);
  Json::Value::~Value((Value *)&keys);
  std::operator+(&local_440,"Key file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyFile);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys2,
                 &local_440,"\' contains invalid \"secret_key\" field: ");
  pVVar2 = Json::Value::operator[](&jv,"secret_key");
  Json::Value::toStyledString_abi_cxx11_(&local_420,pVVar2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys2,
                 &local_420);
  expectedError = (string *)&keyType;
  std::__cxx11::string::operator=((string *)expectedError,(string *)&keys);
  std::__cxx11::string::~string((string *)&keys);
  std::__cxx11::string::~string((string *)&local_420);
  std::__cxx11::string::~string((string *)&keys2);
  std::__cxx11::string::~string((string *)&local_440);
  testKeyFile(this,&keyFile,&jv,expectedError);
  ValidatorKeys::ValidatorKeys(&keys,&keyType_1);
  randomSeed();
  generateKeyPair((pair<jbcoin::PublicKey,_jbcoin::SecretKey> *)&keys2,ed25519,(Seed *)&local_440);
  Seed::~Seed((Seed *)&local_440);
  this_00 = keys2.publicKey_.buf_ + 0x20;
  toBase58_abi_cxx11_(&local_440,(jbcoin *)&DAT_00000020,(TokenType)this_00,
                      (SecretKey *)expectedError);
  Json::Value::Value((Value *)&local_420,&local_440);
  pVVar2 = Json::Value::operator[](&jv,"secret_key");
  Json::Value::operator=(pVVar2,(Value *)&local_420);
  Json::Value::~Value((Value *)&local_420);
  std::__cxx11::string::~string((string *)&local_440);
  SecretKey::~SecretKey((SecretKey *)this_00);
  std::operator+(&local_420,"Key file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyFile);
  std::operator+(&local_440,&local_420,"\' contains invalid \"token_sequence\" field: ");
  pVVar2 = Json::Value::operator[](&jv,"token_sequence");
  Json::Value::toStyledString_abi_cxx11_(&local_378,pVVar2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys2,
                 &local_440,&local_378);
  std::__cxx11::string::operator=((string *)&keyType,(string *)&keys2);
  std::__cxx11::string::~string((string *)&keys2);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_420);
  testKeyFile(this,&keyFile,&jv,(string *)&keyType);
  Json::Value::Value((Value *)&keys2,-1);
  pVVar2 = Json::Value::operator[](&jv,"token_sequence");
  Json::Value::operator=(pVVar2,(Value *)&keys2);
  Json::Value::~Value((Value *)&keys2);
  std::operator+(&local_420,"Key file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyFile);
  std::operator+(&local_440,&local_420,"\' contains invalid \"token_sequence\" field: ");
  pVVar2 = Json::Value::operator[](&jv,"token_sequence");
  Json::Value::toStyledString_abi_cxx11_(&local_378,pVVar2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys2,
                 &local_440,&local_378);
  std::__cxx11::string::operator=((string *)&keyType,(string *)&keys2);
  std::__cxx11::string::~string((string *)&keys2);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_420);
  testKeyFile(this,&keyFile,&jv,(string *)&keyType);
  Json::Value::Value((Value *)&keys2,0xffffffff);
  pVVar2 = Json::Value::operator[](&jv,"token_sequence");
  Json::Value::operator=(pVVar2,(Value *)&keys2);
  Json::Value::~Value((Value *)&keys2);
  std::operator+(&local_420,"Key file \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keyFile);
  std::operator+(&local_440,&local_420,"\' contains invalid \"revoked\" field: ");
  pVVar2 = Json::Value::operator[](&jv,"revoked");
  Json::Value::toStyledString_abi_cxx11_(&local_378,pVVar2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&keys2,
                 &local_440,&local_378);
  std::__cxx11::string::operator=((string *)&keyType,(string *)&keys2);
  std::__cxx11::string::~string((string *)&keys2);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::~string((string *)&local_420);
  testKeyFile(this,&keyFile,&jv,(string *)&keyType);
  Json::Value::Value((Value *)&keys2,false);
  pVVar2 = Json::Value::operator[](&jv,"revoked");
  Json::Value::operator=(pVVar2,(Value *)&keys2);
  Json::Value::~Value((Value *)&keys2);
  std::__cxx11::string::assign((char *)&keyType);
  testKeyFile(this,&keyFile,&jv,(string *)&keyType);
  Json::Value::Value((Value *)&keys2,true);
  pVVar2 = Json::Value::operator[](&jv,"revoked");
  Json::Value::operator=(pVVar2,(Value *)&keys2);
  Json::Value::~Value((Value *)&keys2);
  testKeyFile(this,&keyFile,&jv,(string *)&keyType);
  SecretKey::~SecretKey(&keys.secretKey_);
  Json::Value::~Value(&jv);
  std::__cxx11::string::~string((string *)&error);
  std::__cxx11::string::~string((string *)&keyType);
  KeyFileGuard::~KeyFileGuard(&g);
  std::__cxx11::string::~string((string *)&keyFile);
  std::__cxx11::string::~string((string *)&subdir);
  return;
}

Assistant:

void
    testMakeValidatorKeys ()
    {
        testcase ("Make Validator Keys");

        using namespace boost::filesystem;

        std::string const subdir = "test_key_file";
        path const keyFile = subdir / "validator_keys.json";

        for (auto const keyType : keyTypes)
        {
            ValidatorKeys const keys (keyType);

            KeyFileGuard const g (*this, subdir);

            keys.writeToFile (keyFile);
            BEAST_EXPECT (exists (keyFile));

            auto const keys2 = ValidatorKeys::make_ValidatorKeys (keyFile);
            BEAST_EXPECT (keys == keys2);
        }
        {
            // Require expected fields
            KeyFileGuard g (*this, subdir);

            auto expectedError =
                "Failed to open key file: " + keyFile.string();
            std::string error;
            try {
                ValidatorKeys::make_ValidatorKeys (keyFile);
            } catch (std::runtime_error& e) {
                error = e.what();
            }
            BEAST_EXPECT(error == expectedError);

            expectedError =
                "Unable to parse json key file: " + keyFile.string();

            {
                std::ofstream o (keyFile.string (), std::ios_base::trunc);
                o << "{{}";
                o.close();
            }

            try {
                ValidatorKeys::make_ValidatorKeys (keyFile);
            } catch (std::runtime_error& e) {
                error = e.what();
            }
            BEAST_EXPECT(error == expectedError);

            Json::Value jv;
            jv["dummy"] = "field";
            expectedError = "Key file '" + keyFile.string() +
                "' is missing \"key_type\" field";
            testKeyFile (keyFile, jv, expectedError);

            jv["key_type"] = "dummy keytype";
            expectedError = "Key file '" + keyFile.string() +
                "' is missing \"secret_key\" field";
            testKeyFile (keyFile, jv, expectedError);

            jv["secret_key"] = "dummy secret";
            expectedError = "Key file '" + keyFile.string() +
                "' is missing \"token_sequence\" field";
            testKeyFile (keyFile, jv, expectedError);

            jv["token_sequence"] = "dummy sequence";
            expectedError = "Key file '" + keyFile.string() +
                "' is missing \"revoked\" field";
            testKeyFile (keyFile, jv, expectedError);

            jv["revoked"] = "dummy revoked";
            expectedError = "Key file '" + keyFile.string() +
                "' contains invalid \"key_type\" field: " +
                jv["key_type"].toStyledString();
            testKeyFile (keyFile, jv, expectedError);

            auto const keyType = KeyType::ed25519;
            jv["key_type"] = to_string(keyType);
            expectedError = "Key file '" + keyFile.string() +
                "' contains invalid \"secret_key\" field: " +
                jv["secret_key"].toStyledString();
            testKeyFile (keyFile, jv, expectedError);

            ValidatorKeys const keys (keyType);
            {
                auto const kp = generateKeyPair (keyType, randomSeed ());
                jv["secret_key"] =
                    toBase58(TOKEN_NODE_PRIVATE, kp.second);
            }
            expectedError = "Key file '" + keyFile.string() +
                "' contains invalid \"token_sequence\" field: " +
                jv["token_sequence"].toStyledString();
            testKeyFile (keyFile, jv, expectedError);

            jv["token_sequence"] = -1;
            expectedError = "Key file '" + keyFile.string() +
                "' contains invalid \"token_sequence\" field: " +
                jv["token_sequence"].toStyledString();
            testKeyFile (keyFile, jv, expectedError);

            jv["token_sequence"] =
                Json::UInt(std::numeric_limits<std::uint32_t>::max ());
            expectedError = "Key file '" + keyFile.string() +
                "' contains invalid \"revoked\" field: " +
                jv["revoked"].toStyledString();
            testKeyFile (keyFile, jv, expectedError);

            jv["revoked"] = false;
            expectedError = "";
            testKeyFile (keyFile, jv, expectedError);

            jv["revoked"] = true;
            testKeyFile (keyFile, jv, expectedError);
        }
    }